

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void xmlHashScanFull(xmlHashTablePtr table,xmlHashScannerFull f,void *data)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  int iVar3;
  _xmlHashEntry *p_Var4;
  long lVar5;
  _xmlHashEntry *p_Var6;
  _xmlHashEntry *p_Var7;
  
  if (((f != (xmlHashScannerFull)0x0 && table != (xmlHashTablePtr)0x0) &&
      (table->table != (_xmlHashEntry *)0x0)) && (iVar2 = table->size, 0 < iVar2)) {
    lVar5 = 0;
    do {
      p_Var7 = table->table;
      if (p_Var7 != (_xmlHashEntry *)0x0 && p_Var7[lVar5].valid != 0) {
        p_Var7 = p_Var7 + lVar5;
        iVar2 = table->nbElems;
        do {
          p_Var1 = p_Var7->next;
          iVar3 = iVar2;
          if (p_Var7->payload != (void *)0x0) {
            (*f)(p_Var7->payload,data,p_Var7->name,p_Var7->name2,p_Var7->name3);
            iVar3 = table->nbElems;
          }
          p_Var6 = p_Var1;
          if ((iVar2 != iVar3) && (p_Var4 = table->table + lVar5, p_Var7 == p_Var4)) {
            if (p_Var4->valid == 0) {
              p_Var7 = (_xmlHashEntry *)0x0;
            }
            p_Var6 = p_Var7;
            if (p_Var4->next != p_Var1) {
              p_Var6 = p_Var4;
            }
          }
          p_Var7 = p_Var6;
          iVar2 = iVar3;
        } while (p_Var6 != (_xmlHashEntry *)0x0);
        iVar2 = table->size;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr table, xmlHashScannerFull f, void *data) {
    int i, nb;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
                nb = table->nbElems;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
                if (nb != table->nbElems) {
                    /* table was modified by the callback, be careful */
                    if (iter == &(table->table[i])) {
                        if (table->table[i].valid == 0)
                            iter = NULL;
                        if (table->table[i].next != next)
			    iter = &(table->table[i]);
                    } else
		        iter = next;
                } else
		    iter = next;
	    }
	}
    }
}